

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

char * __thiscall leveldb::Arena::AllocateAligned(Arena *this,size_t bytes)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = this->alloc_ptr_;
  uVar5 = (ulong)((uint)pcVar2 & 7);
  lVar3 = 8 - uVar5;
  if (uVar5 == 0) {
    lVar3 = 0;
  }
  uVar5 = lVar3 + bytes;
  if (this->alloc_bytes_remaining_ < uVar5) {
    pcVar4 = AllocateFallback(this,bytes);
  }
  else {
    pcVar4 = pcVar2 + lVar3;
    this->alloc_ptr_ = pcVar2 + uVar5;
    this->alloc_bytes_remaining_ = this->alloc_bytes_remaining_ - uVar5;
  }
  if (((ulong)pcVar4 & 7) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return pcVar4;
    }
    __stack_chk_fail();
  }
  __assert_fail("(reinterpret_cast<uintptr_t>(result) & (align - 1)) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/arena.cc"
                ,0x36,"char *leveldb::Arena::AllocateAligned(size_t)");
}

Assistant:

char* Arena::AllocateAligned(size_t bytes) {
  const int align = (sizeof(void*) > 8) ? sizeof(void*) : 8;
  static_assert((align & (align - 1)) == 0,
                "Pointer size should be a power of 2");
  size_t current_mod = reinterpret_cast<uintptr_t>(alloc_ptr_) & (align - 1);
  size_t slop = (current_mod == 0 ? 0 : align - current_mod);
  size_t needed = bytes + slop;
  char* result;
  if (needed <= alloc_bytes_remaining_) {
    result = alloc_ptr_ + slop;
    alloc_ptr_ += needed;
    alloc_bytes_remaining_ -= needed;
  } else {
    // AllocateFallback always returned aligned memory
    result = AllocateFallback(bytes);
  }
  assert((reinterpret_cast<uintptr_t>(result) & (align - 1)) == 0);
  return result;
}